

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageBindingRenderCase::ImageBindingRenderCase
          (ImageBindingRenderCase *this,Context *context,char *name,char *desc,ShaderType shaderType
          ,TestType testType,GLenum imageType,GLenum textureType)

{
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"u_image","");
  LayoutBindingRenderCase::LayoutBindingRenderCase
            (&this->super_LayoutBindingRenderCase,context,name,desc,shaderType,testType,0x8f38,
             0x90ca,0x90ce,0x90cf,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_LayoutBindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__ImageBindingRenderCase_0219e138;
  this->m_imageType = imageType;
  this->m_textureType = textureType;
  (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_textureColors).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_textureColors).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_textureColors).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ImageBindingRenderCase::ImageBindingRenderCase (Context&		context,
												const char*		name,
												const char*		desc,
												ShaderType		shaderType,
												TestType		testType,
												glw::GLenum		imageType,
												glw::GLenum		textureType)
	: LayoutBindingRenderCase		(context, name, desc, shaderType, testType, GL_MAX_IMAGE_UNITS, GL_MAX_VERTEX_IMAGE_UNIFORMS, GL_MAX_FRAGMENT_IMAGE_UNIFORMS, GL_MAX_COMBINED_IMAGE_UNIFORMS, "u_image")
	, m_imageType					(imageType)
	, m_textureType					(textureType)
{
}